

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O3

base_learner * cb_algs_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *all_00;
  int iVar2;
  cb *pcVar3;
  option_group_definition *poVar4;
  vw_exception *this;
  size_t sVar5;
  base_learner *l;
  single_learner *base;
  learner<CB_ALGS::cb,_example> *plVar6;
  code *pcVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  size_t ws;
  byte bVar11;
  bool eval;
  string type_string;
  size_type __dnew_3;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  bool local_649;
  cb *local_648;
  _func_int ***local_640;
  _func_int **local_638;
  _func_int **local_630 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  vw *local_600;
  long local_5f8;
  _func_int ***local_5f0;
  _func_int **local_5e8;
  _func_int **local_5e0 [2];
  _func_int ***local_5d0;
  _func_int **local_5c8;
  _func_int **local_5c0 [2];
  string local_5b0;
  option_group_definition local_590;
  long *local_558;
  long local_550;
  long local_548 [2];
  string local_538;
  string local_518;
  string local_4f8;
  undefined1 local_4d8 [112];
  bool local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [18];
  undefined1 uStack_426;
  undefined1 uStack_425;
  undefined2 local_424;
  undefined1 uStack_422;
  undefined1 local_421;
  string local_408 [64];
  bool local_3c8;
  ios_base local_3b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  typed_option<bool> local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar11 = 0;
  pcVar3 = calloc_or_throw<CB_ALGS::cb>(1);
  (pcVar3->cbcs).cb_type = 0;
  *(undefined8 *)&(pcVar3->cbcs).num_actions = 0;
  (pcVar3->cbcs).pred_scores.costs._begin = (wclass *)0x0;
  (pcVar3->cbcs).pred_scores.costs._end = (wclass *)0x0;
  (pcVar3->cbcs).pred_scores.costs.end_array = (wclass *)0x0;
  (pcVar3->cbcs).pred_scores.costs.erase_count = 0;
  (pcVar3->cbcs).scorer = (single_learner *)0x0;
  *(undefined8 *)&(pcVar3->cbcs).avg_loss_regressors = 0;
  (pcVar3->cbcs).nb_ex_regressors = 0;
  (pcVar3->cbcs).last_pred_reg = 0.0;
  (pcVar3->cbcs).last_correct_cost = 0.0;
  (pcVar3->cbcs).known_cost = (cb_class *)0x0;
  (pcVar3->cb_cs_ld).costs._begin = (wclass *)0x0;
  (pcVar3->cb_cs_ld).costs._end = (wclass *)0x0;
  (pcVar3->cb_cs_ld).costs.end_array = (wclass *)0x0;
  (pcVar3->cb_cs_ld).costs.erase_count = 0;
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  local_620.field_2._M_allocated_capacity._0_2_ = 0x7264;
  local_620._M_string_length = 2;
  local_620.field_2._M_local_buf[2] = '\0';
  local_649 = false;
  local_438._0_8_ = (_func_int **)0x19;
  local_648 = pcVar3;
  local_640 = local_630;
  local_640 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_640,(ulong)local_438);
  local_630[0] = (_func_int **)local_438._0_8_;
  builtin_strncpy((char *)((long)local_640 + 9),"l Bandit",8);
  builtin_strncpy((char *)((long)local_640 + 0x11)," Options",8);
  *(undefined4 *)local_640 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_640 + 4),"extu",4);
  *(undefined4 *)(local_640 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_640 + 0xc),"andi",4);
  local_638 = (_func_int **)local_438._0_8_;
  *(char *)((long)local_640 + local_438._0_8_) = '\0';
  local_590.m_name._M_dataplus._M_p = (pointer)&local_590.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_590,local_640,(char *)(local_438._0_8_ + (long)local_640));
  local_590.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_590.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_590.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_640 != local_630) {
    operator_delete(local_640);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0.field_2._M_allocated_capacity._0_2_ = 0x6263;
  local_5b0._M_string_length = 2;
  local_5b0.field_2._M_local_buf[2] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_438,&local_5b0,&(pcVar3->cbcs).num_actions);
  local_3c8 = true;
  local_5d0 = local_5c0;
  local_4d8._0_8_ = (_func_int **)0x2d;
  local_5d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)local_4d8);
  local_5c0[0] = (_func_int **)local_4d8._0_8_;
  builtin_strncpy((char *)((long)local_5d0 + 0x1d),"g with <",8);
  builtin_strncpy((char *)((long)local_5d0 + 0x25),"k> costs",8);
  local_5d0[2] = (_func_int **)0x656c207469646e61;
  local_5d0[3] = (_func_int **)0x7720676e696e7261;
  *local_5d0 = (_func_int **)0x746e6f6320657355;
  local_5d0[1] = (_func_int **)0x62206c6175747865;
  local_5c8 = (_func_int **)local_4d8._0_8_;
  *(char *)((long)local_5d0 + local_4d8._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_408);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_438);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(&local_590,&local_d0);
  local_518.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_518.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_518._M_string_length = 7;
  local_518.field_2._M_local_buf[7] = '\0';
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4d8,&local_518,&local_620);
  local_468 = true;
  local_5f0 = local_5e0;
  local_2b0._0_8_ = (_func_int **)0x2e;
  local_5f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5f0,(ulong)local_2b0);
  local_5e0[0] = (_func_int **)local_2b0._0_8_;
  builtin_strncpy((char *)((long)local_5f0 + 0x1e),"e in {ip",8);
  builtin_strncpy((char *)((long)local_5f0 + 0x26),"s,dm,dr}",8);
  local_5f0[2] = (_func_int **)0x646f6874656d2074;
  local_5f0[3] = (_func_int **)0x20657375206f7420;
  *local_5f0 = (_func_int **)0x75747865746e6f63;
  local_5f0[1] = (_func_int **)0x69646e6162206c61;
  local_5e8 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_5f0 + local_2b0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_4d8 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4d8);
  poVar4 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_170);
  local_538.field_2._M_allocated_capacity._0_4_ = 0x6c617665;
  local_538._M_string_length = 4;
  local_538.field_2._M_local_buf[4] = '\0';
  local_600 = all;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_538,&local_649);
  local_5f8 = 0x29;
  local_558 = local_548;
  local_558 = (long *)std::__cxx11::string::_M_create((ulong *)&local_558,(ulong)&local_5f8);
  local_548[0] = local_5f8;
  builtin_strncpy((char *)((long)local_558 + 0x19),"than opt",8);
  builtin_strncpy((char *)((long)local_558 + 0x21),"imizing.",8);
  local_558[2] = 0x7265687461722079;
  local_558[3] = 0x706f206e61687420;
  *local_558 = 0x657461756c617645;
  local_558[1] = 0x63696c6f70206120;
  local_550 = local_5f8;
  *(char *)((long)local_558 + local_5f8) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_2b0);
  VW::config::option_group_definition::add<bool>(poVar4,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  local_2b0._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd158;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  local_4d8._0_8_ = &PTR__typed_option_002cd158;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd200;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  local_438._0_8_ = &PTR__typed_option_002cd200;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_590);
  pp_Var1 = (_func_int **)(local_438 + 0x10);
  local_438._16_2_ = 0x6263;
  local_438._8_8_ = (pointer)0x2;
  uStack_426 = 0;
  local_438._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options,local_438);
  if ((_func_int **)local_438._0_8_ != pp_Var1) {
    operator_delete((void *)local_438._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar6 = (learner<CB_ALGS::cb,_example> *)0x0;
    pcVar3 = local_648;
  }
  else {
    local_438._16_2_ = 0x6263;
    uStack_426 = 0x5f;
    uStack_425 = 0x74;
    local_424 = 0x7079;
    uStack_422 = 0x65;
    local_438._8_8_ = (pointer)0x7;
    local_421 = 0;
    local_438._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((char)iVar2 == '\0') {
      local_438._16_2_ = 0x6263;
      uStack_426 = 0x5f;
      uStack_425 = 0x74;
      local_424 = 0x7079;
      uStack_422 = 0x65;
      local_438._8_8_ = (pointer)0x7;
      local_421 = 0;
      local_438._0_8_ = pp_Var1;
      (*options->_vptr_options_i[5])(options,local_438,&local_620);
      if ((_func_int **)local_438._0_8_ != pp_Var1) {
        operator_delete((void *)local_438._0_8_);
      }
      (**options->_vptr_options_i)(options,&local_590);
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_620);
    if (iVar2 == 0) {
      ws = 2;
      sVar5 = 0;
      pcVar3 = local_648;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_620);
      pcVar3 = local_648;
      if (iVar2 == 0) {
        sVar5 = 1;
        ws = 1;
        if (local_649 == true) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_438);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_438 + 0x10),
                     "direct method can not be used for evaluation --- it is biased.",0x3e);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_algs.cc"
                     ,0xa5,&local_4f8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_620);
        if (iVar2 == 0) {
          ws = 1;
          sVar5 = 2;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "warning: cb_type must be in {\'ips\',\'dm\',\'dr\'}; resetting to dr.",0x3f);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
          ws = 2;
          sVar5 = 0;
        }
      }
    }
    (pcVar3->cbcs).cb_type = sVar5;
    local_438._16_2_ = 0x7363;
    uStack_426 = 0x6f;
    uStack_425 = 0x61;
    local_424 = 0x61;
    local_438._8_8_ = (pointer)0x5;
    local_438._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_);
    }
    all_00 = local_600;
    pcVar3 = local_648;
    if ((char)iVar2 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_438);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_438 + 0x10));
      local_4d8._16_4_ = 0x616f7363;
      local_4d8._20_2_ = 0x61;
      local_4d8._8_8_ = (pointer)0x5;
      local_4d8._0_8_ = local_4d8 + 0x10;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_4d8,local_2b0);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_);
      }
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_438);
      std::ios_base::~ios_base(local_3b8);
    }
    l = setup_base(options,all_00);
    base = LEARNER::as_singleline<char,char>(l);
    plVar10 = &all_00->p->lp;
    if (local_649 == false) {
      ppuVar9 = &CB::cb_label;
      for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
        plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
        ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
        plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      all_00->label_type = cb;
      plVar6 = LEARNER::learner<CB_ALGS::cb,example>::init_learner<LEARNER::learner<char,example>>
                         (pcVar3,base,CB_ALGS::predict_or_learn<true>,
                          CB_ALGS::predict_or_learn<false>,ws,multiclass);
      pcVar7 = CB_ALGS::finish_example;
    }
    else {
      ppuVar9 = &CB_EVAL::cb_eval;
      for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
        plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
        ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
        plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      all_00->label_type = cb_eval;
      plVar6 = LEARNER::learner<CB_ALGS::cb,example>::init_learner<LEARNER::learner<char,example>>
                         (pcVar3,base,CB_ALGS::learn_eval,CB_ALGS::predict_eval,ws,multiclass);
      pcVar7 = CB_ALGS::eval_finish_example;
    }
    *(undefined8 *)(plVar6 + 0x58) = *(undefined8 *)(plVar6 + 0x18);
    *(code **)(plVar6 + 0x68) = pcVar7;
    (pcVar3->cbcs).scorer = all_00->scorer;
    *(undefined8 *)(plVar6 + 0xb8) = *(undefined8 *)(plVar6 + 0x18);
    *(undefined8 *)(plVar6 + 0xc0) = *(undefined8 *)(plVar6 + 0x20);
    *(code **)(plVar6 + 200) = CB_ALGS::finish;
    pcVar3 = (cb *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_590.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_name._M_dataplus._M_p != &local_590.m_name.field_2) {
    operator_delete(local_590.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p);
  }
  if (pcVar3 != (cb *)0x0) {
    free(pcVar3);
  }
  return (base_learner *)plVar6;
}

Assistant:

base_learner* cb_algs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb>();
  std::string type_string = "dr";
  bool eval = false;

  option_group_definition new_options("Contextual Bandit Options");
  new_options
      .add(make_option("cb", data->cbcs.num_actions).keep().help("Use contextual bandit learning with <k> costs"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"))
      .add(make_option("eval", eval).help("Evaluate a policy rather than optimizing."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb"))
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  cb_to_cs& c = data->cbcs;

  size_t problem_multiplier = 2;  // default for DR
  if (type_string.compare("dr") == 0)
    c.cb_type = CB_TYPE_DR;
  else if (type_string.compare("dm") == 0)
  {
    if (eval)
      THROW("direct method can not be used for evaluation --- it is biased.");
    c.cb_type = CB_TYPE_DM;
    problem_multiplier = 1;
  }
  else if (type_string.compare("ips") == 0)
  {
    c.cb_type = CB_TYPE_IPS;
    problem_multiplier = 1;
  }
  else
  {
    std::cerr << "warning: cb_type must be in {'ips','dm','dr'}; resetting to dr." << std::endl;
    c.cb_type = CB_TYPE_DR;
  }

  if (!options.was_supplied("csoaa"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("csoaa", ss.str());
  }

  auto base = as_singleline(setup_base(options, all));
  if (eval)
  {
    all.p->lp = CB_EVAL::cb_eval;
    all.label_type = label_type::cb_eval;
  }
  else
  {
    all.p->lp = CB::cb_label;
    all.label_type = label_type::cb;
  }

  learner<cb, example>* l;
  if (eval)
  {
    l = &init_learner(data, base, learn_eval, predict_eval, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(eval_finish_example);
  }
  else
  {
    l = &init_learner(
        data, base, predict_or_learn<true>, predict_or_learn<false>, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(finish_example);
  }
  c.scorer = all.scorer;

  l->set_finish(finish);
  return make_base(*l);
}